

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

string * get_yandex_oauth_token_abi_cxx11_(void)

{
  string *in_RDI;
  exception *e;
  int local_19c;
  duration<long,_std::ratio<1L,_1L>_> local_198;
  future_status local_18c;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppStack_188;
  future_status ftr_status;
  Server *local_180;
  thread local_178;
  thread server_thread;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ftr;
  undefined1 local_150 [8];
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  promiseToken;
  undefined1 local_130 [8];
  Server server;
  string *token;
  
  httplib::Server::Server((Server *)local_130);
  promiseToken._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
  .
  super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise((promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_150);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get_future((promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&server_thread);
  local_180 = (Server *)local_130;
  ppStack_188 = (promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_150;
  std::thread::
  thread<void(&)(httplib::Server*,std::promise<std::__cxx11::string>*),httplib::Server*,std::promise<std::__cxx11::string>*,void>
            (&local_178,_listen_server,&local_180,&stack0xfffffffffffffe78);
  system(
        "xdg-open https://oauth.yandex.ru/authorize?client_id=bc2f272cc37349b7a1320b9ac7826ebf\\&response_type=token"
        );
  local_19c = 0x14;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_198,&local_19c);
  local_18c = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<std::__cxx11::string> *)&server_thread,&local_198);
  if (local_18c == ready) {
    std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
        (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &server_thread);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  httplib::Server::stop((Server *)local_130);
  std::thread::join();
  promiseToken._M_storage._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
  .
  super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl._7_1_ = 1;
  std::thread::~thread(&local_178);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&server_thread);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~promise((promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_150);
  if ((promiseToken._M_storage._M_t.
       super___uniq_ptr_impl<std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__future_base::_Result_base::_Deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::__future_base::_Result_base::_Deleter>
       .
       super__Head_base<0UL,_std::__future_base::_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       ._M_head_impl._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  httplib::Server::~Server((Server *)local_130);
  return in_RDI;
}

Assistant:

std::string get_yandex_oauth_token()
{
    httplib::Server server;
    std::string token;

    std::promise<std::string> promiseToken;
    std::future<std::string> ftr = promiseToken.get_future();

    //create and run server on separate thread
    std::thread server_thread(_listen_server, &server, &promiseToken);

    //TODO add win32 browser open
    system("xdg-open https://oauth.yandex.ru/authorize?client_id=bc2f272cc37349b7a1320b9ac7826ebf\\&response_type=token");

    try{
        std::future_status ftr_status = ftr.wait_for(std::chrono::seconds(20));
        if(ftr_status == std::future_status::ready) {
            token = ftr.get();
        } else if (ftr_status == std::future_status::timeout){
            //std::cout << "Timeout!!! token is unknown\n";
        } else {
            //std::cout << "Future status = deffered\n";
        }

    } catch(std::exception & e) {
        //std::cout << e.what() << std::endl;
    }

    server.stop();
    server_thread.join();

    return token;
}